

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifr.c
# Opt level: O1

int igsc_ifr_run_test(igsc_device_handle *handle,uint8_t test_type,uint8_t tiles_mask,
                     uint8_t *result,uint8_t *run_status,uint32_t *error_code)

{
  igsc_lib_ctx *lib_ctx;
  ifr_msg_hdr *resp_header;
  size_t buf_size;
  uint uVar1;
  int iVar2;
  igsc_log_func_t p_Var3;
  char *pcVar4;
  char *pcVar5;
  igsc_log_level_type iVar6;
  int __pri;
  undefined8 uVar7;
  long in_FS_OFFSET;
  size_t received_len;
  char __time_buf [128];
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar8;
  size_t local_c0;
  char local_b8 [128];
  long local_38;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 0;
  if ((((handle == (igsc_device_handle *)0x0) || (error_code == (uint32_t *)0x0)) ||
      (run_status == (uint8_t *)0x0)) ||
     ((result == (uint8_t *)0x0 || (lib_ctx = handle->ctx, lib_ctx == (igsc_lib_ctx *)0x0)))) {
    p_Var3 = igsc_get_log_callback_func();
    if (p_Var3 != (igsc_log_func_t)0x0) {
      p_Var3 = igsc_get_log_callback_func();
      pcVar4 = gsc_time(local_b8,0x80);
      (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ifr_run_test",0xcb);
      iVar2 = 3;
      goto LAB_0010f245;
    }
    pcVar4 = gsc_time(local_b8,0x80);
    pcVar5 = "%s: IGSC: (%s:%s():%d) Bad parameters\n";
    iVar2 = 3;
    uVar7 = 0xcb;
  }
  else {
    uVar1 = igsc_get_log_level();
    if (uVar1 != 0) {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(local_b8,0x80);
        syslog(7,"%s: IGSC: (%s:%s():%d) in run test, initializing driver\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_ifr_run_test",0xd1);
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(local_b8,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) in run test, initializing driver\n",
                  pcVar4,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_ifr_run_test",0xd1);
      }
    }
    iVar2 = gsc_driver_init(lib_ctx,&GUID_METEE_IFR);
    if (iVar2 == 0) {
      resp_header = (ifr_msg_hdr *)lib_ctx->working_buffer;
      buf_size = lib_ctx->working_buffer_length;
      uVar1 = igsc_get_log_level();
      if (uVar1 != 0) {
        p_Var3 = igsc_get_log_callback_func();
        if (p_Var3 == (igsc_log_func_t)0x0) {
          pcVar4 = gsc_time(local_b8,0x80);
          syslog(7,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ifr_run_test",0xe1);
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(local_b8,0x80);
          (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_ifr_run_test",0xe1);
        }
      }
      iVar2 = gsc_fwu_buffer_validate(lib_ctx,8,0xc);
      if (iVar2 == 0) {
        *(undefined8 *)resp_header = 0;
        resp_header->group_id = '\0';
        resp_header->field_0x1 = resp_header->field_0x1 & 0x80;
        resp_header[1].group_id = test_type;
        resp_header[1].field_0x1 = tiles_mask;
        uVar1 = igsc_get_log_level();
        if (uVar1 != 0) {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 == (igsc_log_func_t)0x0) {
            pcVar4 = gsc_time(local_b8,0x80);
            syslog(7,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_ifr_run_test",0xf0);
          }
          else {
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(local_b8,0x80);
            (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ifr_run_test",0xf0);
          }
        }
        iVar2 = gsc_tee_command(lib_ctx,resp_header,8,resp_header,buf_size,&local_c0);
        if (iVar2 != 0) {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 == (igsc_log_func_t)0x0) {
            pcVar4 = gsc_time(local_b8,0x80);
            pcVar5 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
            __pri = 3;
            uVar7 = 0xf5;
            goto LAB_0010f0c1;
          }
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(local_b8,0x80);
          pcVar5 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
          iVar6 = IGSC_LOG_LEVEL_ERROR;
          uVar7 = 0xf5;
          goto LAB_0010f020;
        }
        if (local_c0 < 4) {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 != (igsc_log_func_t)0x0) {
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(local_b8,0x80);
            pcVar5 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
            uVar7 = 0xfb;
            goto LAB_0010f083;
          }
          pcVar4 = gsc_time(local_b8,0x80);
          pcVar5 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
          uVar7 = 0xfb;
LAB_0010f22f:
          syslog(3,pcVar5,pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ifr_run_test",uVar7);
        }
        else {
          *result = resp_header->result;
          iVar2 = ifr_heci_validate_response_header
                            (lib_ctx,resp_header,(byte)resp_header->field_0x1 & 0x7f);
          if (iVar2 == 0) {
            if (resp_header->result != '\0') {
              uVar1 = igsc_get_log_level();
              iVar2 = 6;
              if (uVar1 != 0) {
                p_Var3 = igsc_get_log_callback_func();
                if (p_Var3 == (igsc_log_func_t)0x0) {
                  pcVar4 = gsc_time(local_b8,0x80);
                  pcVar5 = "%s: IGSC: (%s:%s():%d) Run test command failed with result 0x%x\n";
                  __pri = 7;
                  uVar7 = 0x10d;
                  goto LAB_0010f0c1;
                }
                p_Var3 = igsc_get_log_callback_func();
                pcVar4 = gsc_time(local_b8,0x80);
                pcVar5 = "%s: IGSC: (%s:%s():%d) Run test command failed with result 0x%x\n";
                iVar6 = IGSC_LOG_LEVEL_DEBUG;
                uVar7 = 0x10d;
                goto LAB_0010f020;
              }
              goto LAB_0010f23b;
            }
            if (local_c0 < 0xc) {
              p_Var3 = igsc_get_log_callback_func();
              if (p_Var3 == (igsc_log_func_t)0x0) {
                pcVar4 = gsc_time(local_b8,0x80);
                pcVar5 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
                uVar7 = 0x114;
                goto LAB_0010f22f;
              }
              p_Var3 = igsc_get_log_callback_func();
              pcVar4 = gsc_time(local_b8,0x80);
              pcVar5 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
              uVar7 = 0x114;
            }
            else if (resp_header[1].group_id == test_type) {
              if (resp_header[1].field_0x1 == tiles_mask) {
                if (resp_header[1].result == '\0') {
                  *run_status = resp_header[1].reserved;
                  *error_code = (uint32_t)resp_header[2];
                  uVar1 = igsc_get_log_level();
                  iVar2 = 0;
                  if (uVar1 != 0) {
                    p_Var3 = igsc_get_log_callback_func();
                    iVar2 = 0;
                    if (p_Var3 == (igsc_log_func_t)0x0) {
                      pcVar4 = gsc_time(local_b8,0x80);
                      pcVar5 = "%s: IGSC: (%s:%s():%d) run test success\n";
                      __pri = 7;
                      uVar7 = 0x133;
                      goto LAB_0010f0c1;
                    }
                    p_Var3 = igsc_get_log_callback_func();
                    pcVar4 = gsc_time(local_b8,0x80);
                    pcVar5 = "%s: IGSC: (%s:%s():%d) run test success\n";
                    iVar6 = IGSC_LOG_LEVEL_DEBUG;
                    uVar7 = 0x133;
                    goto LAB_0010f020;
                  }
                  goto LAB_0010f23b;
                }
                p_Var3 = igsc_get_log_callback_func();
                if (p_Var3 == (igsc_log_func_t)0x0) {
                  pcVar4 = gsc_time(local_b8,0x80);
                  pcVar5 = "%s: IGSC: (%s:%s():%d) IFR Status response is leaking data\n";
                  uVar7 = 0x12a;
                  goto LAB_0010f22f;
                }
                p_Var3 = igsc_get_log_callback_func();
                pcVar4 = gsc_time(local_b8,0x80);
                pcVar5 = "%s: IGSC: (%s:%s():%d) IFR Status response is leaking data\n";
                uVar7 = 0x12a;
              }
              else {
                p_Var3 = igsc_get_log_callback_func();
                if (p_Var3 == (igsc_log_func_t)0x0) {
                  pcVar4 = gsc_time(local_b8,0x80);
                  pcVar5 = 
                  "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - tiles do not match\n";
                  uVar7 = 0x123;
                  goto LAB_0010f22f;
                }
                p_Var3 = igsc_get_log_callback_func();
                pcVar4 = gsc_time(local_b8,0x80);
                pcVar5 = 
                "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - tiles do not match\n";
                uVar7 = 0x123;
              }
            }
            else {
              p_Var3 = igsc_get_log_callback_func();
              if (p_Var3 == (igsc_log_func_t)0x0) {
                pcVar4 = gsc_time(local_b8,0x80);
                pcVar5 = 
                "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - test type do not match %u %u\n"
                ;
                uVar7 = 0x11c;
                goto LAB_0010f22f;
              }
              p_Var3 = igsc_get_log_callback_func();
              pcVar4 = gsc_time(local_b8,0x80);
              pcVar5 = 
              "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - test type do not match %u %u\n"
              ;
              uVar7 = 0x11c;
            }
LAB_0010f083:
            (*p_Var3)(IGSC_LOG_LEVEL_ERROR,pcVar5,pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ifr_run_test",uVar7);
          }
          else {
            p_Var3 = igsc_get_log_callback_func();
            if (p_Var3 == (igsc_log_func_t)0x0) {
              pcVar4 = gsc_time(local_b8,0x80);
              pcVar5 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n";
              uVar7 = 0x106;
              goto LAB_0010f22f;
            }
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(local_b8,0x80);
            (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                      "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ifr_run_test",0x106,CONCAT44(uVar8,iVar2));
          }
        }
        iVar2 = 6;
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        if (p_Var3 == (igsc_log_func_t)0x0) {
          pcVar4 = gsc_time(local_b8,0x80);
          pcVar5 = "%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n";
          __pri = 3;
          uVar7 = 0xe6;
LAB_0010f0c1:
          syslog(__pri,pcVar5,pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ifr_run_test",uVar7);
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(local_b8,0x80);
          pcVar5 = "%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n";
          iVar6 = IGSC_LOG_LEVEL_ERROR;
          uVar7 = 0xe6;
LAB_0010f020:
          (*p_Var3)(iVar6,pcVar5,pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_ifr_run_test",uVar7);
        }
      }
LAB_0010f23b:
      gsc_driver_deinit(lib_ctx);
      goto LAB_0010f245;
    }
    p_Var3 = igsc_get_log_callback_func();
    if (p_Var3 != (igsc_log_func_t)0x0) {
      p_Var3 = igsc_get_log_callback_func();
      pcVar4 = gsc_time(local_b8,0x80);
      (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",
                pcVar4,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ifr_run_test",0xd6,CONCAT44(uVar8,iVar2));
      goto LAB_0010f245;
    }
    pcVar4 = gsc_time(local_b8,0x80);
    pcVar5 = "%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n";
    uVar7 = 0xd6;
  }
  syslog(3,pcVar5,pcVar4,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
         "igsc_ifr_run_test",uVar7);
LAB_0010f245:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int igsc_ifr_run_test(IN struct igsc_device_handle *handle,
                      IN uint8_t   test_type,
                      IN uint8_t   tiles_mask,
                      OUT uint8_t  *result,
                      OUT uint8_t  *run_status,
                      OUT uint32_t *error_code)
{
    int status;
    size_t request_len;
    size_t response_len;
    size_t received_len = 0;
    size_t buf_len;
    struct igsc_lib_ctx     *lib_ctx;
    struct ifr_run_test_req *req;
    struct ifr_run_test_res *resp;

    if (!handle || !handle->ctx || !result || !run_status || !error_code)
    {
        gsc_error("Bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    lib_ctx = handle->ctx;

    gsc_debug("in run test, initializing driver\n");

    status = gsc_driver_init(lib_ctx, &GUID_METEE_IFR);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Cannot initialize driver, status %d\n", status);
        return status;
    }

    req = (struct ifr_run_test_req *)lib_ctx->working_buffer;
    request_len = sizeof(*req);

    resp = (struct ifr_run_test_res *)lib_ctx->working_buffer;
    response_len = sizeof(*resp);
    buf_len = lib_ctx->working_buffer_length;

    gsc_debug("validating buffer\n");

    status = gsc_fwu_buffer_validate(lib_ctx, request_len, response_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Internal error - failed to validate buffer %d\n", status);
        goto exit;
    }

    memset(req, 0, request_len);
    req->header.group_id = GFX_DIAG_IFR_GROUP;
    req->header.command = IFR_RUN_TEST_CMD;
    req->test_type = test_type;
    req->tiles_map = tiles_mask;

    gsc_debug("sending command\n");

    status = gsc_tee_command(lib_ctx, req, request_len, resp, buf_len, &received_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        goto exit;
    }

    if (received_len < sizeof(resp->header))
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    *result = (uint8_t)resp->header.result;

    status = ifr_heci_validate_response_header(lib_ctx, &resp->header,
                                               req->header.command);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->header.result != 0)
    {
       gsc_debug("Run test command failed with result 0x%x\n", resp->header.result);
       status = IGSC_ERROR_PROTOCOL;
       goto exit;
    }

    if (received_len < response_len)
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->test_type != test_type)
    {
        gsc_error("Error in IFR Run Test response - test type do not match %u %u\n",
                  resp->test_type, test_type);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->tiles_map != tiles_mask)
    {
        gsc_error("Error in IFR Run Test response - tiles do not match\n");
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->reserved !=0)
    {
        gsc_error("IFR Status response is leaking data\n");
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }


    *run_status = resp->run_status;
    *error_code = resp->error_code;

    gsc_debug("run test success\n");

exit:
    gsc_driver_deinit(lib_ctx);
    return status;
}